

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorWell::mouseMoveEvent(QColorWell *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  DropAction flags;
  int iVar3;
  int iVar4;
  QMimeData *this_00;
  QDrag *this_01;
  QWellArray *in_RDI;
  long in_FS_OFFSET;
  QDrag *drg;
  QMimeData *mime;
  int i;
  QPainter p;
  QPixmap pix;
  QColor col;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QWellArray *in_stack_ffffffffffffff18;
  QPointF *in_stack_ffffffffffffff20;
  QMimeData *pQVar5;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QPointF local_58;
  QPoint local_48;
  QPoint local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::mouseMoveEvent
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if ((in_RDI[1].super_QWidget.field_0x8 & 1) != 0) {
    local_58 = QSinglePointEvent::position((QSinglePointEvent *)0x731cb2);
    local_48 = QPointF::toPoint(in_stack_ffffffffffffff20);
    local_40 = ::operator-((QPoint *)in_stack_ffffffffffffff20,(QPoint *)in_stack_ffffffffffffff18);
    iVar1 = QPoint::manhattanLength((QPoint *)in_stack_ffffffffffffff20);
    iVar2 = QApplication::startDragDistance();
    if (iVar2 < iVar1) {
      flags = QPoint::x((QPoint *)0x731d25);
      iVar1 = QPoint::y((QPoint *)0x731d37);
      (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1a0))(in_RDI,flags,iVar1);
      iVar1 = QPoint::y((QPoint *)0x731d59);
      iVar1 = QWellArray::rowAt(in_RDI,iVar1);
      QPoint::x((QPoint *)0x731d77);
      iVar2 = QWellArray::columnAt(in_stack_ffffffffffffff18,iVar1);
      iVar3 = QWellArray::numRows(in_RDI);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QColor::QColor((QColor *)&local_38,
                     *(uint *)(*(long *)&in_RDI[1].super_QWidget + (long)(iVar1 + iVar2 * iVar3) * 4
                              ));
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      pQVar5 = this_00;
      QColor::operator_cast_to_QVariant((QColor *)&local_28);
      QMimeData::setColorData((QVariant *)pQVar5);
      ::QVariant::~QVariant(&local_28);
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QWellArray::cellWidth(in_RDI);
      iVar4 = QWellArray::cellHeight(in_RDI);
      QPixmap::QPixmap((QPixmap *)&local_70,iVar3,iVar4);
      QPixmap::fill((QColor *)&local_70);
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_78,(QPaintDevice *)&local_70);
      iVar4 = QPixmap::width();
      iVar4 = iVar4 + -1;
      QPixmap::height();
      QPainter::drawRect((QPainter *)CONCAT44(iVar4,iVar3),(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,
                         (int)((ulong)this_00 >> 0x20),(int)this_00);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,(QObject *)in_RDI);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      in_RDI[1].super_QWidget.field_0x8 = 0;
      QFlags<Qt::DropAction>::QFlags((QFlags<Qt::DropAction> *)CONCAT44(iVar1,iVar2),flags);
      QDrag::exec((QFlags_conflict1 *)this_01);
      QPainter::~QPainter((QPainter *)&local_78);
      QPixmap::~QPixmap((QPixmap *)&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorWell::mouseMoveEvent(QMouseEvent *e)
{
    QWellArray::mouseMoveEvent(e);
#if QT_CONFIG(draganddrop)
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        setCurrent(oldCurrent.x(), oldCurrent.y());
        int i = rowAt(pressPos.y()) + columnAt(pressPos.x()) * numRows();
        QColor col(values[i]);
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(cellWidth(), cellHeight());
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}